

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::Pow::dim_forward
          (Dim *__return_storage_ptr__,Pow *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  invalid_argument *this_00;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  ushort uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  int iVar25;
  Dim r;
  string asStack_1b8 [32];
  undefined8 local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined8 uStack_184;
  uint local_17c;
  undefined4 local_178;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar1 != 0x48) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0x307,"virtual Dim cnn::Pow::dim_forward(const vector<Dim> &) const");
  }
  __return_storage_ptr__->bd = pDVar1->bd;
  uVar4 = *(undefined8 *)(pDVar1->d + 2);
  uVar7 = *(undefined8 *)(pDVar1->d + 4);
  uVar8 = *(undefined8 *)(pDVar1->d + 6);
  *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar1->d;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar4;
  *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar7;
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar8;
  uVar9 = (ulong)pDVar1->nd;
  uVar13 = 1;
  iVar25 = 1;
  if (uVar9 != 0) {
    auVar17 = vpbroadcastq_avx512f();
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar11 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar21 = vmovdqa64_avx512f(auVar18);
      auVar18 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar18,auVar19);
      auVar18 = vporq_avx512f(auVar18,auVar20);
      uVar4 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar22,auVar17,2);
      bVar6 = (byte)uVar4;
      uVar15 = CONCAT11(bVar6,bVar5);
      auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pDVar1->d + uVar11));
      auVar22._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar18._4_4_;
      auVar22._0_4_ = (uint)(bVar5 & 1) * auVar18._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar18._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar18._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar18._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar18._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar18._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar18._28_4_;
      auVar22._32_4_ = (uint)(bVar6 & 1) * auVar18._32_4_;
      auVar22._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar18._36_4_;
      auVar22._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar18._40_4_;
      auVar22._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar18._44_4_;
      auVar22._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar18._48_4_;
      auVar22._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar18._52_4_;
      auVar22._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar18._56_4_;
      auVar22._60_4_ = (uint)(bVar6 >> 7) * auVar18._60_4_;
      auVar18 = vpmulld_avx512f(auVar22,auVar21);
      uVar11 = uVar11 + 0x10;
    } while ((uVar9 + 0xf & 0x1fffffff0) != uVar11);
    auVar18 = vmovdqa32_avx512f(auVar18);
    auVar17._0_4_ = (uint)(bVar5 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar21._0_4_;
    bVar14 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar17._4_4_ = (uint)bVar14 * auVar18._4_4_ | (uint)!bVar14 * auVar21._4_4_;
    bVar14 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar17._8_4_ = (uint)bVar14 * auVar18._8_4_ | (uint)!bVar14 * auVar21._8_4_;
    bVar14 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar17._12_4_ = (uint)bVar14 * auVar18._12_4_ | (uint)!bVar14 * auVar21._12_4_;
    bVar14 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar17._16_4_ = (uint)bVar14 * auVar18._16_4_ | (uint)!bVar14 * auVar21._16_4_;
    bVar14 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar17._20_4_ = (uint)bVar14 * auVar18._20_4_ | (uint)!bVar14 * auVar21._20_4_;
    bVar14 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar17._24_4_ = (uint)bVar14 * auVar18._24_4_ | (uint)!bVar14 * auVar21._24_4_;
    bVar14 = (bool)((byte)(uVar15 >> 7) & 1);
    auVar17._28_4_ = (uint)bVar14 * auVar18._28_4_ | (uint)!bVar14 * auVar21._28_4_;
    auVar17._32_4_ = (uint)(bVar6 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar21._32_4_;
    bVar14 = (bool)(bVar6 >> 1 & 1);
    auVar17._36_4_ = (uint)bVar14 * auVar18._36_4_ | (uint)!bVar14 * auVar21._36_4_;
    bVar14 = (bool)(bVar6 >> 2 & 1);
    auVar17._40_4_ = (uint)bVar14 * auVar18._40_4_ | (uint)!bVar14 * auVar21._40_4_;
    bVar14 = (bool)(bVar6 >> 3 & 1);
    auVar17._44_4_ = (uint)bVar14 * auVar18._44_4_ | (uint)!bVar14 * auVar21._44_4_;
    bVar14 = (bool)(bVar6 >> 4 & 1);
    auVar17._48_4_ = (uint)bVar14 * auVar18._48_4_ | (uint)!bVar14 * auVar21._48_4_;
    bVar14 = (bool)(bVar6 >> 5 & 1);
    auVar17._52_4_ = (uint)bVar14 * auVar18._52_4_ | (uint)!bVar14 * auVar21._52_4_;
    bVar14 = (bool)(bVar6 >> 6 & 1);
    auVar17._56_4_ = (uint)bVar14 * auVar18._56_4_ | (uint)!bVar14 * auVar21._56_4_;
    auVar17._60_4_ =
         (uint)(bVar6 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar21._60_4_;
    auVar16 = vextracti64x4_avx512f(auVar17,1);
    auVar17 = vpmulld_avx512f(auVar17,ZEXT3264(auVar16));
    auVar2 = vpmulld_avx(auVar17._0_16_,auVar17._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    iVar25 = auVar2._0_4_;
  }
  uVar10 = iVar25 * pDVar1->bd;
  if (1 < uVar10) {
    uVar11 = 1;
    uVar12 = 1;
    do {
      if (uVar12 < uVar9) {
        bVar14 = 1 < pDVar1->d[uVar12];
      }
      else {
        bVar14 = false;
      }
      uVar12 = uVar12 + 1;
      if (bVar14) {
        uVar11 = uVar12 & 0xffffffff;
      }
      uVar13 = (uint)uVar11;
    } while (uVar10 != uVar12);
  }
  __return_storage_ptr__->nd = uVar13;
  uVar9 = (ulong)pDVar1[1].nd;
  local_17c = 1;
  iVar25 = 1;
  if (uVar9 != 0) {
    auVar17 = vpbroadcastq_avx512f();
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar11 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar21 = vmovdqa64_avx512f(auVar18);
      auVar18 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar18,auVar19);
      auVar18 = vporq_avx512f(auVar18,auVar20);
      uVar4 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar22,auVar17,2);
      bVar6 = (byte)uVar4;
      uVar15 = CONCAT11(bVar6,bVar5);
      auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pDVar1[1].d + uVar11));
      auVar23._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar18._4_4_;
      auVar23._0_4_ = (uint)(bVar5 & 1) * auVar18._0_4_;
      auVar23._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar18._8_4_;
      auVar23._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar18._12_4_;
      auVar23._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar18._16_4_;
      auVar23._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar18._20_4_;
      auVar23._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar18._24_4_;
      auVar23._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar18._28_4_;
      auVar23._32_4_ = (uint)(bVar6 & 1) * auVar18._32_4_;
      auVar23._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar18._36_4_;
      auVar23._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar18._40_4_;
      auVar23._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar18._44_4_;
      auVar23._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar18._48_4_;
      auVar23._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar18._52_4_;
      auVar23._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar18._56_4_;
      auVar23._60_4_ = (uint)(bVar6 >> 7) * auVar18._60_4_;
      auVar18 = vpmulld_avx512f(auVar23,auVar21);
      uVar11 = uVar11 + 0x10;
    } while ((uVar9 + 0xf & 0x1fffffff0) != uVar11);
    auVar17 = vmovdqa32_avx512f(auVar18);
    auVar18._0_4_ = (uint)(bVar5 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar21._0_4_;
    bVar14 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar14 * auVar17._4_4_ | (uint)!bVar14 * auVar21._4_4_;
    bVar14 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar14 * auVar17._8_4_ | (uint)!bVar14 * auVar21._8_4_;
    bVar14 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar14 * auVar17._12_4_ | (uint)!bVar14 * auVar21._12_4_;
    bVar14 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar14 * auVar17._16_4_ | (uint)!bVar14 * auVar21._16_4_;
    bVar14 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar14 * auVar17._20_4_ | (uint)!bVar14 * auVar21._20_4_;
    bVar14 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar14 * auVar17._24_4_ | (uint)!bVar14 * auVar21._24_4_;
    bVar14 = (bool)((byte)(uVar15 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar14 * auVar17._28_4_ | (uint)!bVar14 * auVar21._28_4_;
    auVar18._32_4_ = (uint)(bVar6 & 1) * auVar17._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar21._32_4_;
    bVar14 = (bool)(bVar6 >> 1 & 1);
    auVar18._36_4_ = (uint)bVar14 * auVar17._36_4_ | (uint)!bVar14 * auVar21._36_4_;
    bVar14 = (bool)(bVar6 >> 2 & 1);
    auVar18._40_4_ = (uint)bVar14 * auVar17._40_4_ | (uint)!bVar14 * auVar21._40_4_;
    bVar14 = (bool)(bVar6 >> 3 & 1);
    auVar18._44_4_ = (uint)bVar14 * auVar17._44_4_ | (uint)!bVar14 * auVar21._44_4_;
    bVar14 = (bool)(bVar6 >> 4 & 1);
    auVar18._48_4_ = (uint)bVar14 * auVar17._48_4_ | (uint)!bVar14 * auVar21._48_4_;
    bVar14 = (bool)(bVar6 >> 5 & 1);
    auVar18._52_4_ = (uint)bVar14 * auVar17._52_4_ | (uint)!bVar14 * auVar21._52_4_;
    bVar14 = (bool)(bVar6 >> 6 & 1);
    auVar18._56_4_ = (uint)bVar14 * auVar17._56_4_ | (uint)!bVar14 * auVar21._56_4_;
    auVar18._60_4_ =
         (uint)(bVar6 >> 7) * auVar17._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar21._60_4_;
    auVar16 = vextracti64x4_avx512f(auVar18,1);
    auVar17 = vpmulld_avx512f(auVar18,ZEXT3264(auVar16));
    auVar2 = vpmulld_avx(auVar17._0_16_,auVar17._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    iVar25 = auVar2._0_4_;
  }
  uVar13 = iVar25 * pDVar1[1].bd;
  if (1 < uVar13) {
    local_17c = 1;
    uVar11 = 0;
    do {
      uVar12 = uVar11 + 1;
      if (uVar12 < uVar9) {
        bVar14 = 1 < pDVar1[1].d[uVar11 + 1];
      }
      else {
        bVar14 = false;
      }
      if (bVar14) {
        local_17c = (int)uVar11 + 2;
      }
      uVar11 = uVar12;
    } while ((ulong)uVar13 - 1 != uVar12);
  }
  uStack_188 = (undefined4)((ulong)*(undefined8 *)(pDVar1[1].d + 3) >> 0x20);
  uStack_184 = *(undefined8 *)(pDVar1[1].d + 5);
  local_198 = *(undefined8 *)pDVar1[1].d;
  uStack_190 = (undefined4)*(undefined8 *)(pDVar1[1].d + 2);
  uStack_18c = (undefined4)((ulong)*(undefined8 *)(pDVar1[1].d + 2) >> 0x20);
  local_178 = 1;
  if (local_17c != 0) {
    auVar17 = vpbroadcastq_avx512f();
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar9 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar21 = vmovdqa64_avx512f(auVar18);
      auVar18 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar18,auVar19);
      auVar18 = vporq_avx512f(auVar18,auVar20);
      uVar4 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar22,auVar17,2);
      bVar6 = (byte)uVar4;
      uVar15 = CONCAT11(bVar6,bVar5);
      auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)&local_198 + uVar9 * 4));
      auVar24._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar18._4_4_;
      auVar24._0_4_ = (uint)(bVar5 & 1) * auVar18._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar18._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar18._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar18._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar18._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar18._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar18._28_4_;
      auVar24._32_4_ = (uint)(bVar6 & 1) * auVar18._32_4_;
      auVar24._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar18._36_4_;
      auVar24._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar18._40_4_;
      auVar24._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar18._44_4_;
      auVar24._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar18._48_4_;
      auVar24._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar18._52_4_;
      auVar24._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar18._56_4_;
      auVar24._60_4_ = (uint)(bVar6 >> 7) * auVar18._60_4_;
      auVar18 = vpmulld_avx512f(auVar24,auVar21);
      uVar9 = uVar9 + 0x10;
    } while (((ulong)local_17c + 0xf & 0x1fffffff0) != uVar9);
    auVar17 = vmovdqa32_avx512f(auVar18);
    auVar19._0_4_ = (uint)(bVar5 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar21._0_4_;
    bVar14 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar19._4_4_ = (uint)bVar14 * auVar17._4_4_ | (uint)!bVar14 * auVar21._4_4_;
    bVar14 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar19._8_4_ = (uint)bVar14 * auVar17._8_4_ | (uint)!bVar14 * auVar21._8_4_;
    bVar14 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar19._12_4_ = (uint)bVar14 * auVar17._12_4_ | (uint)!bVar14 * auVar21._12_4_;
    bVar14 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar19._16_4_ = (uint)bVar14 * auVar17._16_4_ | (uint)!bVar14 * auVar21._16_4_;
    bVar14 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar19._20_4_ = (uint)bVar14 * auVar17._20_4_ | (uint)!bVar14 * auVar21._20_4_;
    bVar14 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar19._24_4_ = (uint)bVar14 * auVar17._24_4_ | (uint)!bVar14 * auVar21._24_4_;
    bVar14 = (bool)((byte)(uVar15 >> 7) & 1);
    auVar19._28_4_ = (uint)bVar14 * auVar17._28_4_ | (uint)!bVar14 * auVar21._28_4_;
    auVar19._32_4_ = (uint)(bVar6 & 1) * auVar17._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar21._32_4_;
    bVar14 = (bool)(bVar6 >> 1 & 1);
    auVar19._36_4_ = (uint)bVar14 * auVar17._36_4_ | (uint)!bVar14 * auVar21._36_4_;
    bVar14 = (bool)(bVar6 >> 2 & 1);
    auVar19._40_4_ = (uint)bVar14 * auVar17._40_4_ | (uint)!bVar14 * auVar21._40_4_;
    bVar14 = (bool)(bVar6 >> 3 & 1);
    auVar19._44_4_ = (uint)bVar14 * auVar17._44_4_ | (uint)!bVar14 * auVar21._44_4_;
    bVar14 = (bool)(bVar6 >> 4 & 1);
    auVar19._48_4_ = (uint)bVar14 * auVar17._48_4_ | (uint)!bVar14 * auVar21._48_4_;
    bVar14 = (bool)(bVar6 >> 5 & 1);
    auVar19._52_4_ = (uint)bVar14 * auVar17._52_4_ | (uint)!bVar14 * auVar21._52_4_;
    bVar14 = (bool)(bVar6 >> 6 & 1);
    auVar19._56_4_ = (uint)bVar14 * auVar17._56_4_ | (uint)!bVar14 * auVar21._56_4_;
    auVar19._60_4_ =
         (uint)(bVar6 >> 7) * auVar17._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar21._60_4_;
    auVar16 = vextracti64x4_avx512f(auVar19,1);
    auVar17 = vpmulld_avx512f(auVar19,ZEXT3264(auVar16));
    auVar2 = vpmulld_avx(auVar17._0_16_,auVar17._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    if (auVar2._0_4_ != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_198,"Bad input dimensions in Pow: ",0x1d);
      operator<<((ostream *)&local_198,xs);
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(this_00,asStack_1b8);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string LogisticSigmoid::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "\\sigma(" << arg_names[0] << ')';
  return s.str();
}